

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::DallasReadMemory(AmpIO *this,unsigned_short addr,uchar *data,uint nbytes)

{
  bool bVar1;
  uint32_t uVar2;
  uint local_58;
  uint local_54;
  uchar *puStack_40;
  uint nb;
  uchar *ptr;
  uint uStack_30;
  bool useDS2480B;
  uint32_t ctrl;
  uint32_t status;
  uint nbytes_local;
  uchar *data_local;
  AmpIO *pAStack_18;
  unsigned_short addr_local;
  AmpIO *this_local;
  
  ctrl = nbytes;
  _status = data;
  data_local._6_2_ = addr;
  pAStack_18 = this;
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 7) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x64524131) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = DallasWriteControl(this,(uint)data_local._6_2_ << 0x10 | 2);
      if (bVar1) {
        bVar1 = DallasWaitIdle(this);
        if (bVar1) {
          bVar1 = DallasReadStatus(this,&stack0xffffffffffffffd0);
          puStack_40 = _status;
          if (bVar1) {
            if (ctrl < 0x101) {
              local_54 = ctrl;
            }
            else {
              local_54 = 0x100;
            }
            bVar1 = DallasReadBlock(this,_status,local_54);
            if (bVar1) {
              puStack_40 = puStack_40 + local_54;
              for (ctrl = ctrl - local_54; ctrl != 0; ctrl = ctrl - local_58) {
                bVar1 = DallasWriteControl(this,3);
                if (!bVar1) {
                  return false;
                }
                bVar1 = DallasWaitIdle(this);
                if (!bVar1) {
                  return false;
                }
                if (ctrl < 0x101) {
                  local_58 = ctrl;
                }
                else {
                  local_58 = 0x100;
                }
                bVar1 = DallasReadBlock(this,puStack_40,local_58);
                if (!bVar1) {
                  return false;
                }
                puStack_40 = puStack_40 + local_58;
              }
              if ((uStack_30 & 0x8000) == 0x8000) {
                bVar1 = DallasWriteControl(this,9);
                if (!bVar1) {
                  return false;
                }
                bVar1 = DallasWaitIdle(this);
                if (!bVar1) {
                  return false;
                }
              }
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::DallasReadMemory(unsigned short addr, unsigned char *data, unsigned int nbytes)
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == dRA1_String) return false;

    uint32_t status;
    uint32_t ctrl = (addr<<16)|2;
    if (!DallasWriteControl(ctrl)) return false;
    if (!DallasWaitIdle()) return false;
    if (!DallasReadStatus(status)) return false;

    // Automatically detect interface in use
    bool useDS2480B = (status & 0x00008000) == 0x00008000;

    unsigned char *ptr = data;
    // Read first block of data (up to 256 bytes)
    unsigned int nb = (nbytes>256) ? 256 : nbytes;
    if (!DallasReadBlock(ptr, nb)) return false;
    ptr += nb;
    nbytes -= nb;
    // Read additional blocks of data if necessary
    while (nbytes > 0) {
        // 0x03 indicates reg_wdata[1:0] == 11 in firmware DS2505.v
        if (!DallasWriteControl(0x03)) return false;
        if (!DallasWaitIdle()) return false;
        nb = (nbytes>256) ? 256 : nbytes;
        if (!DallasReadBlock(ptr, nb)) return false;
        ptr += nb;
        nbytes -= nb;
    }
    // End all blocks reading for DS2480B interface
    if (nbytes <= 0 && useDS2480B) {
        // 0x09 indicates reg_wdata[3] == 1 && reg_wdata[1:0] == 01 in firmware DS2505.v
        if (!DallasWriteControl(0x09)) return false;
        if (!DallasWaitIdle()) return false;
    }
    return true;
}